

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O2

char * sx_os_path_unixpath(char *dst,int size,char *path)

{
  uint uVar1;
  int var__a;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  
  uVar2 = sx_strlen(path);
  uVar1 = size - 1U;
  if ((int)uVar2 < (int)(size - 1U)) {
    uVar1 = uVar2;
  }
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    cVar5 = path[uVar3];
    if (cVar5 == '\\') {
      cVar5 = '/';
    }
    dst[uVar3] = cVar5;
  }
  dst[(int)uVar1] = '\0';
  return dst;
}

Assistant:

char* sx_os_path_unixpath(char* dst, int size, const char* path)
{
    int len = sx_strlen(path);
    len = sx_min(len, size - 1);

    for (int i = 0; i < len; i++) {
        if (path[i] != '\\')
            dst[i] = path[i];
        else
            dst[i] = '/';
    }
    dst[len] = '\0';
    return dst;
}